

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O3

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_five(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
            *this)

{
  pointer pIVar1;
  pointer pVVar2;
  pointer pAVar3;
  pointer pAVar4;
  Index row;
  Index col;
  unsigned_long local_30;
  Index local_28;
  
  pIVar1 = (this->path_).
           super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar2 = (this->graph_->vertices_).
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = *(pointer *)&pVVar2[pIVar1[-1].col].from_;
  pAVar4 = *(pointer *)((long)(pVVar2 + pIVar1[-1].col) + 8);
  if (pAVar3 != pAVar4) {
    do {
      while ((this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[pAVar3->edge_] != 1) {
        pAVar3 = pAVar3 + 1;
        if (pAVar3 == pAVar4) goto LAB_00138ca0;
      }
      local_30 = pAVar3->vertex_;
      if (local_30 == 0xffffffffffffffff) goto LAB_00138ca9;
      std::
      vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
      ::emplace_back<unsigned_long&,unsigned_long&>
                ((vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
                  *)&this->path_,&local_30,&pIVar1[-1].col);
      local_28 = find_prime_in_row(this,(this->path_).
                                        super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                                        ._M_impl.super__Vector_impl_data._M_finish[-1].row);
      std::
      vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
      ::emplace_back<unsigned_long&,unsigned_long_const&>
                ((vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
                  *)&this->path_,
                 &(this->path_).
                  super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].row,&local_28);
      pIVar1 = (this->path_).
               super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pVVar2 = (this->graph_->vertices_).
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar3 = *(pointer *)&pVVar2[pIVar1[-1].col].from_;
      pAVar4 = *(pointer *)((long)(pVVar2 + pIVar1[-1].col) + 8);
    } while (pAVar3 != pAVar4);
  }
LAB_00138ca0:
  local_30 = 0xffffffffffffffff;
LAB_00138ca9:
  augment(this);
  clear_covers(this);
  erase_primes(this);
  this->step_ = THREE;
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_five()
{
    Index row;
    while (true) {
        row = find_star_in_col(path_.back().col);
        if (row == IDXMAX) {
            break;
        }

        path_.emplace_back(row, path_.back().col);

        auto const col = find_prime_in_row(path_.back().row);
        path_.emplace_back(path_.back().row, col);
    }

    augment();
    clear_covers();
    erase_primes();
    step_ = Step::THREE;
}